

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

string * units::definedUnitsFromFile(string *__return_storage_ptr__,string *filename)

{
  char cVar1;
  istream *piVar2;
  size_type sVar3;
  size_type sVar4;
  string *this;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  precise_measurement meas;
  string userdef;
  string line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> meas_string;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  ifstream infile;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&infile,(string *)filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
LAB_003340bb:
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&infile,(string *)&line);
      if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) goto LAB_003344cf;
      sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&line," \t\n",0);
      if (sVar3 != 0xffffffffffffffff) {
        cVar1 = line._M_dataplus._M_p[sVar3];
        if (cVar1 == '\'') {
LAB_00334113:
          bVar7 = true;
          lVar6 = 1;
          while (bVar7) {
            sVar4 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &line,line._M_dataplus._M_p[sVar3],lVar6 + sVar3);
            if (sVar4 == 0xffffffffffffffff) {
              lVar6 = 1;
              break;
            }
            bVar7 = line._M_dataplus._M_p[sVar4 - 1] == '\\';
            if (bVar7) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                    sVar4 - 1,1);
            }
            lVar6 = sVar4 - sVar3;
          }
        }
        else {
          if (cVar1 == '#') goto LAB_003340bb;
          lVar6 = 1;
          if (cVar1 == '\"') goto LAB_00334113;
        }
        sVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&line,",;=",lVar6 + sVar3);
        if (sVar4 == 0xffffffffffffffff) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &userdef,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&line," is not a valid user defined unit definition\n");
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef);
        }
        else {
          if (sVar4 == line._M_string_length - 1) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &userdef,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&line," does not have any valid definitions\n");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef);
            std::__cxx11::string::~string((string *)&userdef);
          }
          if ((byte)(line._M_dataplus._M_p[sVar4 + 1] - 0x3dU) < 2) {
            uVar5 = 1;
          }
          else {
            uVar5 = (ulong)(line._M_dataplus._M_p[sVar4 - 1] == '<');
            if (line._M_dataplus._M_p[sVar4 - 1] == '<') {
              sVar4 = sVar4 - 1;
            }
          }
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,sVar3,
                 sVar4 - sVar3);
          while( true ) {
            if (userdef._M_dataplus._M_p[userdef._M_string_length - 1] != ' ') break;
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef);
          }
          cVar1 = *userdef._M_dataplus._M_p;
          if (((cVar1 == '\'') || (cVar1 == '\"')) &&
             (userdef._M_dataplus._M_p[userdef._M_string_length - 1] == cVar1)) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef
                       ,(__const_iterator)userdef._M_dataplus._M_p);
          }
          if (userdef._M_string_length == 0) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meas_string,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &line," does not specify a user string\n");
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&meas_string
                  );
          }
          else {
            sVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                    find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&line," \t",sVar4 + uVar5 + 1);
            if (sVar3 == 0xffffffffffffffff) {
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &meas_string,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &line," does not specify a unit definition string\n");
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &meas_string);
            }
            else {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              substr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &meas_string,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                     sVar3,0xffffffffffffffff);
              while( true ) {
                if (meas_string._M_dataplus._M_p[meas_string._M_string_length - 1] != ' ') break;
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meas_string);
              }
              cVar1 = *meas_string._M_dataplus._M_p;
              if (((cVar1 == '\'') || (cVar1 == '\"')) &&
                 (meas_string._M_dataplus._M_p[meas_string._M_string_length - 1] == cVar1)) {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::pop_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &meas_string);
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                erase(&meas_string,(__const_iterator)meas_string._M_dataplus._M_p);
              }
              std::__cxx11::string::string
                        ((string *)&local_258,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &meas_string);
              measurement_from_string(&meas,&local_258,defaultMatchFlags);
              std::__cxx11::string::~string((string *)&local_258);
              bVar7 = is_valid(&meas);
              if (bVar7) {
                if (line._M_dataplus._M_p[uVar5 + sVar4] == '>') {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedInputUnit(&userdef,(precise_unit *)&local_2b8);
                }
                else if (line._M_dataplus._M_p[sVar4] == '<') {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedOutputUnit(&userdef,(precise_unit *)&local_2b8);
                }
                else {
                  local_2b8._M_dataplus._M_p = (pointer)(meas.value_ * meas.units_.multiplier_);
                  local_2b8._M_string_length._0_4_ = meas.units_.base_units_;
                  local_2b8._M_string_length._4_4_ = meas.units_.commodity_;
                  addUserDefinedUnit(&userdef,(precise_unit *)&local_2b8);
                }
              }
              else {
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::substr(&local_278,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                         sVar3,0xffffffffffffffff);
                std::operator+(&local_2b8,&local_278," does not generate a valid unit\n");
                CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __return_storage_ptr__,&local_2b8);
                std::__cxx11::string::~string((string *)&local_2b8);
                std::__cxx11::string::~string((string *)&local_278);
              }
            }
          }
          std::__cxx11::string::~string((string *)&meas_string);
        }
        std::__cxx11::string::~string((string *)&userdef);
      }
    } while( true );
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef,
                 "unable to read file ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)filename);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&userdef,"\n")
  ;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&line);
  std::__cxx11::string::~string((string *)&line);
  this = &userdef;
LAB_003344d4:
  std::__cxx11::string::~string((string *)this);
  std::ifstream::~ifstream(&infile);
  return __return_storage_ptr__;
LAB_003344cf:
  this = &line;
  goto LAB_003344d4;
}

Assistant:

std::string definedUnitsFromFile(const std::string& filename) noexcept
{
    std::string output;
    try {
        std::ifstream infile(filename);
        if (!infile.is_open()) {
            output = "unable to read file " + filename + "\n";
            return output;
        }
        std::string line;
        while (std::getline(infile, line)) {
            auto commentloc = line.find_first_not_of(" \t\n");
            if (commentloc == std::string::npos || line[commentloc] == '#') {
                continue;
            }
            std::size_t esep{1};  // extra separation location to handle quotes
            if (line[commentloc] == '\"' || line[commentloc] == '\'') {
                bool notfound{true};
                while (notfound) {
                    esep =
                        line.find_first_of(line[commentloc], commentloc + esep);
                    if (esep == std::string::npos) {
                        esep = 1;
                        break;
                    }
                    if (line[esep - 1] != '\\') {
                        notfound = false;
                    } else {
                        // remove the escaped quote
                        line.erase(esep - 1, 1);
                    }
                    esep -= commentloc;
                }
            }
            auto sep = line.find_first_of(",;=", commentloc + esep);
            if (sep == std::string::npos) {
                output +=
                    line + " is not a valid user defined unit definition\n";
                continue;
            }
            if (sep == line.size() - 1) {
                output += line + " does not have any valid definitions\n";
            }
            int length{0};
            if (line[sep + 1] == '=' || line[sep + 1] == '>') {
                length = 1;
            }
            if (length == 0 && line[sep - 1] == '<') {
                length = 1;
                --sep;
            }
            // get the new definition name
            std::string userdef = line.substr(commentloc, sep - commentloc);
            while (userdef.back() == ' ') {
                userdef.pop_back();
            }
            // remove quotes
            if ((userdef.front() == '\"' || userdef.front() == '\'') &&
                userdef.back() == userdef.front()) {
                userdef.pop_back();
                userdef.erase(userdef.begin());
            }
            if (userdef.empty()) {
                output += line + " does not specify a user string\n";
                continue;
            }
            // the unit string
            auto sloc = line.find_first_not_of(" \t", sep + length + 1);
            if (sloc == std::string::npos) {
                output += line + " does not specify a unit definition string\n";
                continue;
            }
            auto meas_string = line.substr(sloc);
            while (meas_string.back() == ' ') {
                meas_string.pop_back();
            }
            if ((meas_string.front() == '\"' || meas_string.front() == '\'') &&
                meas_string.back() == meas_string.front()) {
                meas_string.pop_back();
                meas_string.erase(meas_string.begin());
            }
            auto meas = measurement_from_string(meas_string);
            if (!is_valid(meas)) {
                output +=
                    line.substr(sloc) + " does not generate a valid unit\n";
                continue;
            }

            if (line[sep + length] == '>') {
                addUserDefinedInputUnit(userdef, meas.as_unit());
            } else if (line[sep] == '<') {
                addUserDefinedOutputUnit(userdef, meas.as_unit());
            } else {
                addUserDefinedUnit(userdef, meas.as_unit());
            }
        }
    }
    // LCOV_EXCL_START
    catch (const std::exception& e) {
        output += e.what();
        output.push_back('\n');
        // this is mainly just to catch any weird errors coming from somewhere
        // so this function can be noexcept
    }
    // LCOV_EXCL_STOP
    return output;
}